

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::PostEmscripten::optimizeExceptions::OptimizeInvokes::create(OptimizeInvokes *this)

{
  long in_RSI;
  _func_int **local_20;
  
  std::
  make_unique<wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::OptimizeInvokes,std::map<wasm::Function*,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info,std::less<wasm::Function*>,std::allocator<std::pair<wasm::Function*const,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info>>>&,wasm::TableUtils::FlatTable&>
            ((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
              *)&local_20,*(FlatTable **)(in_RSI + 0x108));
  (this->super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
  ).super_Pass._vptr_Pass = local_20;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<OptimizeInvokes>(map, flatTable);
      }